

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O0

Expr * __thiscall SQCompilation::SQParser::LogicalOrExp(SQParser *this)

{
  BinExpr *args_1;
  Expr *in_RDI;
  Expr *rhs;
  Expr *lhs;
  NestingChecker nc;
  SQParser *in_stack_ffffffffffffff98;
  NestingChecker *in_stack_ffffffffffffffa0;
  SQParser *in_stack_ffffffffffffffb0;
  SQParser *in_stack_ffffffffffffffd0;
  BinExpr *local_20;
  SQParser *in_stack_fffffffffffffff0;
  
  NestingChecker::NestingChecker(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  args_1 = (BinExpr *)LogicalAndExp(in_stack_fffffffffffffff0);
  local_20 = args_1;
  while( true ) {
    NestingChecker::inc(in_stack_ffffffffffffffa0);
    if (*(long *)&(in_RDI->super_Node)._op != 0x10f) break;
    Lex(in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb0 = (SQParser *)LogicalOrExp(in_stack_fffffffffffffff0);
    local_20 = newNode<SQCompilation::BinExpr,TreeOp,SQCompilation::Expr*,SQCompilation::Expr*>
                         (in_stack_ffffffffffffffd0,
                          (TreeOp)((ulong)in_stack_ffffffffffffffb0 >> 0x20),&args_1->super_Expr,
                          in_RDI);
  }
  NestingChecker::~NestingChecker((NestingChecker *)&stack0xffffffffffffffe8);
  return &local_20->super_Expr;
}

Assistant:

Expr* SQParser::LogicalOrExp()
{
    NestingChecker nc(this);
    Expr *lhs = LogicalAndExp();
    for (;;) {
        nc.inc();
        if (_token == TK_OR) {
            Lex();

            Expr *rhs = LogicalOrExp();
            lhs = newNode<BinExpr>(TO_OROR, lhs, rhs);
        }
        else return lhs;
    }
}